

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O3

void __thiscall
UdpBitDht::ConnectionAuth
          (UdpBitDht *this,bdId *srcId,bdId *proxyId,bdId *destId,uint32_t mode,uint32_t loc,
          uint32_t bandwidth,uint32_t delay,uint32_t answer)

{
  pthread_mutex_lock((pthread_mutex_t *)&this->dhtMtx);
  (*(this->mBitDhtManager->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher[0x14])
            (this->mBitDhtManager,srcId,proxyId,destId,(ulong)mode,(ulong)loc,(ulong)bandwidth,
             (ulong)delay,(ulong)answer);
  pthread_mutex_unlock((pthread_mutex_t *)&this->dhtMtx);
  return;
}

Assistant:

void UdpBitDht::ConnectionAuth(bdId *srcId, bdId *proxyId, bdId *destId, uint32_t mode, uint32_t loc, 
								uint32_t bandwidth, uint32_t delay, uint32_t answer) {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	mBitDhtManager->ConnectionAuth(srcId, proxyId, destId, mode, loc, bandwidth, delay, answer);
}